

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock.c
# Opt level: O1

int sem_wait_nointr(sem_t *sem)

{
  int iVar1;
  int *piVar2;
  int cs;
  int local_c;
  
  pthread_setcancelstate(1,&local_c);
  do {
    iVar1 = sem_wait((sem_t *)sem);
    if (-1 < iVar1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  iVar1 = pthread_setcancelstate(local_c,(int *)0x0);
  return iVar1;
}

Assistant:

static int
sem_wait_nointr(sem_t *sem)
{
	int rc;
	int cs;
	(void)pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, &cs);

	do {
		rc = sem_wait(sem);
	} while (rc < 0 && errno == EINTR);

	(void)pthread_setcancelstate(cs, NULL);

	return rc;
}